

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GenerateTargetInstallRules
          (cmLocalGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurationTypes)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar4;
  char *pcVar5;
  ulong uVar6;
  string *psVar7;
  undefined1 local_4f0 [8];
  cmInstallScriptGenerator g_3;
  string local_408;
  char *local_3e8;
  char *postinstall;
  cmInstallTargetGeneratorLocal g_2;
  cmInstallTargetGeneratorLocal g_1;
  undefined1 local_1b0 [8];
  string destination;
  undefined1 local_170 [8];
  cmInstallScriptGenerator g;
  string local_88;
  char *local_68;
  char *preinstall;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_50;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_48;
  iterator l;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> tgts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurationTypes_local;
  string *config_local;
  ostream *os_local;
  cmLocalGenerator *this_local;
  
  __x = GetGeneratorTargets(this);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l,__x);
  local_48._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                 ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l);
  do {
    local_50._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l);
    bVar2 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar2) {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l);
      return;
    }
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_48);
    TVar3 = cmGeneratorTarget::GetType(*ppcVar4);
    if (TVar3 != INTERFACE_LIBRARY) {
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_48);
      pcVar1 = *ppcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_88,"PRE_INSTALL_SCRIPT",(allocator *)&g.field_0xdf);
      pcVar5 = cmGeneratorTarget::GetProperty(pcVar1,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)&g.field_0xdf);
      local_68 = pcVar5;
      if (pcVar5 != (char *)0x0) {
        cmInstallScriptGenerator::cmInstallScriptGenerator
                  ((cmInstallScriptGenerator *)local_170,pcVar5,false,(char *)0x0,false);
        cmScriptGenerator::Generate((cmScriptGenerator *)local_170,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator((cmInstallScriptGenerator *)local_170);
      }
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_48);
      cmTarget::GetInstallPath_abi_cxx11_
                ((string *)((long)&destination.field_2 + 8),(*ppcVar4)->Target);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&destination.field_2 + 8),"");
      std::__cxx11::string::~string((string *)(destination.field_2._M_local_buf + 8));
      if (bVar2) {
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_48);
        cmTarget::GetInstallPath_abi_cxx11_
                  ((string *)&g_1.super_cmInstallTargetGenerator.NamelinkMode,(*ppcVar4)->Target);
        std::__cxx11::string::substr
                  ((ulong)local_1b0,(ulong)&g_1.super_cmInstallTargetGenerator.NamelinkMode);
        std::__cxx11::string::~string((string *)&g_1.super_cmInstallTargetGenerator.NamelinkMode);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_1b0);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) != 0) {
          std::__cxx11::string::operator=((string *)local_1b0,".");
        }
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_48);
        TVar3 = cmGeneratorTarget::GetType(*ppcVar4);
        if (TVar3 < SHARED_LIBRARY) {
LAB_00685d3f:
          ppcVar4 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_48);
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar4);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)
                     &g_2.super_cmInstallTargetGenerator.NamelinkMode,this,psVar7,pcVar5,false);
          cmScriptGenerator::Generate
                    ((cmScriptGenerator *)&g_2.super_cmInstallTargetGenerator.NamelinkMode,os,config
                     ,configurationTypes);
          cmInstallTargetGeneratorLocal::~cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)
                     &g_2.super_cmInstallTargetGenerator.NamelinkMode);
        }
        else if (TVar3 == SHARED_LIBRARY) {
          ppcVar4 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_48);
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar4);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)&postinstall,this,psVar7,pcVar5,false);
          cmScriptGenerator::Generate
                    ((cmScriptGenerator *)&postinstall,os,config,configurationTypes);
          cmInstallTargetGeneratorLocal::~cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)&postinstall);
        }
        else if (TVar3 == MODULE_LIBRARY) goto LAB_00685d3f;
        std::__cxx11::string::~string((string *)local_1b0);
      }
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_48);
      pcVar1 = *ppcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_408,"POST_INSTALL_SCRIPT",(allocator *)&g_3.field_0xdf);
      pcVar5 = cmGeneratorTarget::GetProperty(pcVar1,&local_408);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator((allocator<char> *)&g_3.field_0xdf);
      local_3e8 = pcVar5;
      if (pcVar5 != (char *)0x0) {
        cmInstallScriptGenerator::cmInstallScriptGenerator
                  ((cmInstallScriptGenerator *)local_4f0,pcVar5,false,(char *)0x0,false);
        cmScriptGenerator::Generate((cmScriptGenerator *)local_4f0,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator((cmInstallScriptGenerator *)local_4f0);
      }
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&local_48);
  } while( true );
}

Assistant:

void cmLocalGenerator::GenerateTargetInstallRules(
  std::ostream& os, const std::string& config,
  std::vector<std::string> const& configurationTypes)
{
  // Convert the old-style install specification from each target to
  // an install generator and run it.
  std::vector<cmGeneratorTarget*> tgts = this->GetGeneratorTargets();
  for (std::vector<cmGeneratorTarget*>::iterator l = tgts.begin();
       l != tgts.end(); ++l) {
    if ((*l)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    // Include the user-specified pre-install script for this target.
    if (const char* preinstall = (*l)->GetProperty("PRE_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(preinstall, false, CM_NULLPTR, false);
      g.Generate(os, config, configurationTypes);
    }

    // Install this target if a destination is given.
    if ((*l)->Target->GetInstallPath() != "") {
      // Compute the full install destination.  Note that converting
      // to unix slashes also removes any trailing slash.
      // We also skip over the leading slash given by the user.
      std::string destination = (*l)->Target->GetInstallPath().substr(1);
      cmSystemTools::ConvertToUnixSlashes(destination);
      if (destination.empty()) {
        destination = ".";
      }

      // Generate the proper install generator for this target type.
      switch ((*l)->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY: {
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, (*l)->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
        } break;
        case cmStateEnums::SHARED_LIBRARY: {
#if defined(_WIN32) || defined(__CYGWIN__)
          // Special code to handle DLL.  Install the import library
          // to the normal destination and the DLL to the runtime
          // destination.
          cmInstallTargetGeneratorLocal g1(this, (*l)->GetName(),
                                           destination.c_str(), true);
          g1.Generate(os, config, configurationTypes);
          // We also skip over the leading slash given by the user.
          destination = (*l)->Target->GetRuntimeInstallPath().substr(1);
          cmSystemTools::ConvertToUnixSlashes(destination);
          cmInstallTargetGeneratorLocal g2(this, (*l)->GetName(),
                                           destination.c_str(), false);
          g2.Generate(os, config, configurationTypes);
#else
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, (*l)->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
#endif
        } break;
        default:
          break;
      }
    }

    // Include the user-specified post-install script for this target.
    if (const char* postinstall = (*l)->GetProperty("POST_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(postinstall, false, CM_NULLPTR, false);
      g.Generate(os, config, configurationTypes);
    }
  }
}